

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

bool __thiscall absl::lts_20240722::base_internal::SpinLock::TryLockImpl(SpinLock *this)

{
  uint32_t uVar1;
  uint32_t lock_value;
  SpinLock *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = TryLockInternal(this,(this->lockword_).super___atomic_base<unsigned_int>._M_i,0);
  return (uVar1 & 1) == 0;
}

Assistant:

inline bool TryLockImpl() {
    uint32_t lock_value = lockword_.load(std::memory_order_relaxed);
    return (TryLockInternal(lock_value, 0) & kSpinLockHeld) == 0;
  }